

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_common.c
# Opt level: O3

int hash_iter(HashTable *table,void *key,void **_value,void **iter)

{
  uint32 uVar1;
  int iVar2;
  HashItem **ppHVar3;
  void *pvVar4;
  HashItem *pHVar5;
  
  if (*iter == (void *)0x0) {
    ppHVar3 = table->table;
    uVar1 = (*table->hash)(key,table->data);
    ppHVar3 = ppHVar3 + (table->table_len - 1 & uVar1);
  }
  else {
    ppHVar3 = (HashItem **)((long)*iter + 0x10);
  }
  pHVar5 = *ppHVar3;
  do {
    if (pHVar5 == (HashItem *)0x0) {
      pHVar5 = (HashItem *)0x0;
      pvVar4 = (void *)0x0;
      iVar2 = 0;
LAB_00120ab6:
      *_value = pvVar4;
      *iter = pHVar5;
      return iVar2;
    }
    iVar2 = (*table->keymatch)(key,pHVar5->key,table->data);
    if (iVar2 != 0) {
      pvVar4 = pHVar5->value;
      iVar2 = 1;
      goto LAB_00120ab6;
    }
    pHVar5 = pHVar5->next;
  } while( true );
}

Assistant:

int hash_iter(const HashTable *table, const void *key,
              const void **_value, void **iter)
{
    HashItem *item = (HashItem *) *iter;
    if (item == NULL)
        item = table->table[calc_hash(table, key)];
    else
        item = item->next;

    while (item != NULL)
    {
        if (table->keymatch(key, item->key, table->data))
        {
            *_value = item->value;
            *iter = item;
            return 1;
        } // if
        item = item->next;
    } // while

    // no more matches.
    *_value = NULL;
    *iter = NULL;
    return 0;
}